

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  size_type sVar1;
  reference pvVar2;
  long in_RSI;
  int in_EDI;
  double dVar3;
  double dVar4;
  int i_1;
  size_t j;
  size_t i;
  FILE *fp;
  vector<interest_point,_std::allocator<interest_point>_> interest_points;
  fasthessian *fh;
  integral_image *iimage;
  float *image;
  int channels;
  int height;
  int width;
  fasthessian *in_stack_ffffffffffffff40;
  vector<interest_point,_std::allocator<interest_point>_> *in_stack_ffffffffffffff48;
  fasthessian *in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  size_type sVar5;
  int local_7c;
  ulong local_78;
  size_type local_70;
  vector<interest_point,_std::allocator<interest_point>_> *in_stack_ffffffffffffff98;
  FILE *pFVar6;
  fasthessian *in_stack_ffffffffffffffa0;
  vector<interest_point,_std::allocator<interest_point>_> local_50;
  fasthessian *local_38;
  integral_image *local_30;
  float *local_28;
  uint local_1c;
  long local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 3) {
    local_10 = in_RSI;
    stbi_ldr_to_hdr_gamma(1.0);
    local_28 = stbi_loadf(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff58,(int *)in_stack_ffffffffffffff50,
                          (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    if (local_28 == (float *)0x0) {
      printf("Could not open or find image\n");
      local_4 = -1;
    }
    else {
      local_30 = create_integral_img((int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                                     (int)in_stack_ffffffffffffff40);
      compute_integral_img(local_28,local_30);
      local_38 = create_fast_hessian((integral_image *)in_stack_ffffffffffffff40);
      create_response_map(in_stack_ffffffffffffff50);
      compute_response_layers(in_stack_ffffffffffffff40);
      std::vector<interest_point,_std::allocator<interest_point>_>::vector
                ((vector<interest_point,_std::allocator<interest_point>_> *)0x1091b4);
      get_interest_points(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      get_msurf_descriptors((integral_image *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      __stream = fopen(*(char **)(local_10 + 0x10),"w");
      printf("%d %d %d\n",(ulong)(uint)local_30->width,(ulong)(uint)local_30->height,(ulong)local_1c
            );
      local_70 = 0;
      while( true ) {
        sVar5 = local_70;
        sVar1 = std::vector<interest_point,_std::allocator<interest_point>_>::size(&local_50);
        if (sVar1 <= sVar5) break;
        pFVar6 = __stream;
        pvVar2 = std::vector<interest_point,_std::allocator<interest_point>_>::operator[]
                           (&local_50,local_70);
        in_stack_ffffffffffffff50 = (fasthessian *)(double)pvVar2->x;
        pvVar2 = std::vector<interest_point,_std::allocator<interest_point>_>::operator[]
                           (&local_50,local_70);
        dVar3 = (double)pvVar2->y;
        pvVar2 = std::vector<interest_point,_std::allocator<interest_point>_>::operator[]
                           (&local_50,local_70);
        dVar4 = (double)pvVar2->scale;
        pvVar2 = std::vector<interest_point,_std::allocator<interest_point>_>::operator[]
                           (&local_50,local_70);
        fprintf(__stream,"%f %f %f %d ",in_stack_ffffffffffffff50,dVar3,dVar4,
                (ulong)(pvVar2->laplacian & 1));
        __stream = pFVar6;
        for (local_78 = 0; local_78 < 0x40; local_78 = local_78 + 1) {
          pFVar6 = __stream;
          pvVar2 = std::vector<interest_point,_std::allocator<interest_point>_>::operator[]
                             (&local_50,local_70);
          fprintf(__stream,"%f ",(double)pvVar2->descriptor[local_78]);
          __stream = pFVar6;
        }
        fprintf(__stream,"\n");
        local_70 = local_70 + 1;
      }
      fclose(__stream);
      stbi_image_free((void *)0x1093ae);
      free(local_30->padded_data);
      free(local_30);
      for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
        free(local_38->response_map[local_7c]->response);
        free(local_38->response_map[local_7c]->laplacian);
        free(local_38->response_map[local_7c]);
      }
      free(local_38);
      local_4 = 0;
      std::vector<interest_point,_std::allocator<interest_point>_>::~vector
                ((vector<interest_point,_std::allocator<interest_point>_> *)
                 in_stack_ffffffffffffff50);
    }
  }
  else {
    printf("Invaid argument count.\nUsage:\n\t./surf image_path descriptor_file_target_path\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char const *argv[])
{
    if (argc != 3) {
        printf("Invaid argument count.\nUsage:\n\t./surf image_path descriptor_file_target_path\n");
        return 1;
    }
	int width, height, channels;

	// Load image
	stbi_ldr_to_hdr_gamma(1.0f);
	float* image = stbi_loadf(argv[1], &width, &height, &channels, STBI_grey);

    if (!image) {
		printf("Could not open or find image\n");
        return -1;
    }

	// Create integral image
	struct integral_image* iimage = create_integral_img(width, height);
	// Compute integral image
	compute_integral_img(image, iimage);

	// Fast-Hessian
	struct fasthessian* fh = create_fast_hessian(iimage);

	// Create octaves with response layers
	create_response_map(fh);

	// Compute responses for every layer
	compute_response_layers(fh);

	// Getting interest points with non-maximum supression
	std::vector<struct interest_point> interest_points;
	get_interest_points(fh, &interest_points);

    // printf("interest points: %lu\n", interest_points.size());

	// Getting M-SURF descriptors for each interest point
	get_msurf_descriptors(iimage, &interest_points);

	// Write results to file
    FILE * fp = fopen(argv[2],"w");
    printf("%d %d %d\n", iimage->width, iimage->height, channels);
	for (size_t i=0; i<interest_points.size(); ++i) {
        fprintf(fp, "%f %f %f %d ", interest_points[i].x, interest_points[i].y, interest_points[i].scale, interest_points[i].laplacian);
        for(size_t j = 0; j < 64; j++) {
            fprintf(fp, "%f ", interest_points[i].descriptor[j]);
        }
        fprintf(fp, "\n");
    }
    fclose(fp);

	// Free memory
	stbi_image_free(image); // possibly move this to create_integral_img
	free(iimage->padded_data);
	free(iimage);
	for (int i = 0; i < NUM_LAYERS; ++i) {
		free(fh->response_map[i]->response);
		free(fh->response_map[i]->laplacian);
		free(fh->response_map[i]);
	}
	free(fh);

	return 0;
}